

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O0

void ranges::detail::
     introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,ranges::less,ranges::identity>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,
               long depth_limit,less *pred,identity *proj)

{
  long middle;
  int iVar1;
  difference_type dVar2;
  reference_wrapper<ranges::less> pred_00;
  reference_wrapper<ranges::identity> proj_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> cut;
  identity *proj_local;
  less *pred_local;
  long depth_limit_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  pred_local = (less *)depth_limit;
  depth_limit_local = (long)last._M_current;
  last_local._M_current = first._M_current;
  while( true ) {
    dVar2 = __gnu_cxx::operator-
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       &depth_limit_local,&last_local);
    iVar1 = introsort_threshold();
    _Var3 = last_local;
    middle = depth_limit_local;
    if (dVar2 <= iVar1) {
      return;
    }
    if (pred_local == (less *)0x0) break;
    _Var3 = unguarded_partition<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ranges::less,ranges::identity>
                      (last_local,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       depth_limit_local,pred,proj);
    pred_local = pred_local + -1;
    introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,ranges::less,ranges::identity>
              (_Var3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                     depth_limit_local,(long)pred_local,pred,proj);
    depth_limit_local = (long)_Var3;
  }
  pred_00 = std::ref<ranges::less>(pred);
  proj_00 = std::ref<ranges::identity>(proj);
  partial_sort_fn::
  operator()<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<ranges::less>,_std::reference_wrapper<ranges::identity>_>
            ((partial_sort_fn *)&partial_sort,_Var3,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)middle,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)middle,pred_00,
             proj_00);
  return;
}

Assistant:

inline void introsort_loop(I first, I last, Size depth_limit, C & pred, P & proj)
        {
            while(last - first > detail::introsort_threshold())
            {
                if(depth_limit == 0)
                    return partial_sort(
                               first, last, last, std::ref(pred), std::ref(proj)),
                           void();
                I cut = detail::unguarded_partition(first, last, pred, proj);
                detail::introsort_loop(cut, last, --depth_limit, pred, proj);
                last = cut;
            }
        }